

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_MuxRestruct_rec(Gia_Man_t *pNew,Str_Ntk_t *pNtk,Str_Mux_t *pTree,Str_Mux_t *pRoot,int Edge,
                       Vec_Int_t *vDelay,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Str_Mux_t *pRoot_00;
  Str_Ntk_t *pNtk_00;
  
  pNtk_00 = (Str_Ntk_t *)(ulong)(uint)Edge;
  pRoot_00 = Str_MuxFindBranching(pRoot,Edge);
  if (pRoot_00 == (Str_Mux_t *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar1 = Str_MuxRestruct_rec(pNew,pNtk,pTree,pRoot_00,0,vDelay,fVerbose);
    uVar2 = Str_MuxRestruct_rec(pNew,pNtk,pTree,pRoot_00,1,vDelay,fVerbose);
    uVar2 = uVar2 | uVar1;
    pNtk_00 = pNtk;
  }
  uVar1 = Str_MuxTryOnce(pNew,pNtk_00,pTree,pRoot,Edge,vDelay,fVerbose);
  return uVar1 | uVar2;
}

Assistant:

int Str_MuxRestruct_rec( Gia_Man_t * pNew, Str_Ntk_t * pNtk, Str_Mux_t * pTree, Str_Mux_t * pRoot, int Edge, Vec_Int_t * vDelay, int fVerbose )
{
    int fChanges = 0;
    Str_Mux_t * pMux = Str_MuxFindBranching( pRoot, Edge );
    if ( pMux != NULL )
        fChanges |= Str_MuxRestruct_rec( pNew, pNtk, pTree, pMux, 0, vDelay, fVerbose );
    if ( pMux != NULL )
        fChanges |= Str_MuxRestruct_rec( pNew, pNtk, pTree, pMux, 1, vDelay, fVerbose );
    fChanges |= Str_MuxTryOnce( pNew, pNtk, pTree, pRoot, Edge, vDelay, fVerbose );
    return fChanges;
}